

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.c
# Opt level: O0

void ff_init_longdouble(flexfloat_t *obj,longdouble value,flexfloat_desc_t desc)

{
  undefined2 in_SI;
  double *in_RDI;
  undefined8 in_stack_00000008;
  
  *in_RDI = (double)(longdouble)CONCAT28(value._0_2_,in_stack_00000008);
  *(undefined2 *)(in_RDI + 1) = in_SI;
  flexfloat_sanitize(SUB108(value,0));
  return;
}

Assistant:

INLINE void ff_init_longdouble(flexfloat_t *obj, long double value, flexfloat_desc_t desc) {
    obj->value = (fp_t)value;
    #ifdef FLEXFLOAT_TRACKING
    obj->exact_value = (fp_t)value;;
    obj->tracking_fn = 0;
    obj->tracking_arg = 0;
    #endif
    obj->desc = desc;
    flexfloat_sanitize(obj);
}